

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerator::Logger::Warning(Logger *this,GenT genType,string *message)

{
  long lVar1;
  string *psVar2;
  char *pcVar3;
  lock_guard<std::mutex> local_98;
  lock_guard<std::mutex> lock;
  string local_70;
  undefined1 local_40 [8];
  string msg;
  string *message_local;
  GenT genType_local;
  Logger *this_local;
  
  msg.field_2._8_8_ = message;
  std::__cxx11::string::string((string *)local_40);
  lVar1 = std::__cxx11::string::find((char)msg.field_2._8_8_,10);
  if (lVar1 == -1) {
    psVar2 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
    std::__cxx11::string::operator+=((string *)local_40,(string *)psVar2);
    std::__cxx11::string::operator+=((string *)local_40," warning: ");
  }
  else {
    psVar2 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock,psVar2
                   ," warning");
    HeadLine(&local_70,(string *)&lock);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&lock);
  }
  std::__cxx11::string::operator+=((string *)local_40,(string *)msg.field_2._8_8_);
  pcVar3 = (char *)std::__cxx11::string::back();
  if (*pcVar3 != '\n') {
    std::__cxx11::string::push_back((char)local_40);
  }
  std::__cxx11::string::push_back((char)local_40);
  std::lock_guard<std::mutex>::lock_guard(&local_98,&this->Mutex_);
  cmSystemTools::Stdout((string *)local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Warning(GenT genType,
                                        std::string const& message)
{
  std::string msg;
  if (message.find('\n') == std::string::npos) {
    // Single line message
    msg += GeneratorName(genType);
    msg += " warning: ";
  } else {
    // Multi line message
    msg += HeadLine(GeneratorName(genType) + " warning");
  }
  // Message
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stdout(msg);
  }
}